

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindLargest(MergingIterator *this)

{
  Comparator *pCVar1;
  bool bVar2;
  int iVar3;
  Slice local_48;
  Slice local_38;
  IteratorWrapper *local_28;
  IteratorWrapper *child;
  IteratorWrapper *pIStack_18;
  int i;
  IteratorWrapper *largest;
  MergingIterator *this_local;
  
  pIStack_18 = (IteratorWrapper *)0x0;
  child._4_4_ = this->n_;
  largest = (IteratorWrapper *)this;
  while (child._4_4_ = child._4_4_ + -1, -1 < child._4_4_) {
    local_28 = this->children_ + child._4_4_;
    bVar2 = IteratorWrapper::Valid(local_28);
    if (bVar2) {
      if (pIStack_18 == (IteratorWrapper *)0x0) {
        pIStack_18 = local_28;
      }
      else {
        pCVar1 = this->comparator_;
        local_38 = IteratorWrapper::key(local_28);
        local_48 = IteratorWrapper::key(pIStack_18);
        iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_38,&local_48);
        if (0 < iVar3) {
          pIStack_18 = local_28;
        }
      }
    }
  }
  this->current_ = pIStack_18;
  return;
}

Assistant:

void MergingIterator::FindLargest() {
  IteratorWrapper* largest = nullptr;
  for (int i = n_ - 1; i >= 0; i--) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (largest == nullptr) {
        largest = child;
      } else if (comparator_->Compare(child->key(), largest->key()) > 0) {
        largest = child;
      }
    }
  }
  current_ = largest;
}